

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O1

void DeleteHistoryItem(pyhanabi_history_item_t *item)

{
  if (item == (pyhanabi_history_item_t *)0x0) {
    __assert_fail("item != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,200,"void DeleteHistoryItem(pyhanabi_history_item_t *)");
  }
  if (item->item != (void *)0x0) {
    operator_delete(item->item);
    item->item = (void *)0x0;
    return;
  }
  __assert_fail("item->item != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0xc9,"void DeleteHistoryItem(pyhanabi_history_item_t *)");
}

Assistant:

void DeleteHistoryItem(pyhanabi_history_item_t* item) {
  REQUIRE(item != nullptr);
  REQUIRE(item->item != nullptr);
  delete reinterpret_cast<hanabi_learning_env::HanabiHistoryItem*>(item->item);
  item->item = nullptr;
}